

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  byte *pbVar1;
  stbi_uc *psVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  stbi_uc *psVar12;
  uint uVar13;
  stbi_uc sVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  char *zout;
  uint uVar19;
  long lVar20;
  size_t sVar21;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  int local_a30;
  byte local_a08 [31];
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_00111932:
    a->num_bits = 0;
    a->code_buffer = 0;
    do {
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar6 = a->num_bits;
      uVar4 = a->code_buffer;
      a->code_buffer = uVar4 >> 1;
      a->num_bits = iVar6 + -1;
      if (iVar6 < 3) {
        stbi__fill_bits(a);
      }
      iVar6 = a->num_bits;
      uVar9 = a->code_buffer;
      a->code_buffer = uVar9 >> 2;
      a->num_bits = iVar6 - 2U;
      local_a30 = 0;
      switch(uVar9 & 3) {
      case 0:
        uVar9 = iVar6 - 2U & 7;
        if (uVar9 != 0) {
          if (iVar6 < 2) {
            stbi__fill_bits(a);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar9;
          a->num_bits = a->num_bits - uVar9;
        }
        iVar6 = a->num_bits;
        if (iVar6 < 1) {
          uVar7 = 0;
        }
        else {
          uVar9 = a->code_buffer;
          uVar7 = 0;
          iVar16 = iVar6;
          do {
            *(char *)((long)local_814.fast + uVar7) = (char)uVar9;
            uVar7 = uVar7 + 1;
            uVar9 = uVar9 >> 8;
            iVar6 = iVar16 + -8;
            bVar3 = 8 < iVar16;
            iVar16 = iVar6;
          } while (bVar3);
          a->code_buffer = uVar9;
          a->num_bits = iVar6;
        }
        if (iVar6 != 0) {
          __assert_fail("a->num_bits == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/stb_image.h"
                        ,0xebc,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
        }
        if ((uint)uVar7 < 4) {
          psVar12 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          uVar7 = uVar7 & 0xffffffff;
          do {
            if (psVar12 < psVar2) {
              a->zbuffer = psVar12 + 1;
              sVar14 = *psVar12;
              psVar12 = psVar12 + 1;
            }
            else {
              sVar14 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar7) = sVar14;
            uVar7 = uVar7 + 1;
          } while (uVar7 != 4);
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
          uVar7 = (ulong)local_814.fast[0];
          if (a->zbuffer_end < a->zbuffer + uVar7) {
            stbi__g_failure_reason = "read past buffer";
          }
          else if ((a->zout + uVar7 <= a->zout_end) ||
                  (iVar6 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar6 != 0)) {
            memcpy(a->zout,a->zbuffer,uVar7);
            a->zbuffer = a->zbuffer + uVar7;
            a->zout = a->zout + uVar7;
            goto LAB_0011225e;
          }
        }
        else {
          stbi__g_failure_reason = "zlib corrupt";
        }
        goto LAB_0011229b;
      case 1:
        if (stbi__zdefault_distance[0x1f] == '\0') {
          memset(stbi__zdefault_length,8,0x90);
          builtin_memcpy(stbi__zdefault_length + 0x90,
                         "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                         ,0x90);
          builtin_memcpy(stbi__zdefault_distance,
                         "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                         ,0x20);
        }
        iVar6 = stbi__zbuild_huffman(&a->z_length,stbi__zdefault_length,0x120);
        if (iVar6 == 0) {
          return 0;
        }
        iVar6 = stbi__zbuild_huffman(&a->z_distance,stbi__zdefault_distance,0x20);
        uVar13 = uVar4;
        if (iVar6 == 0) {
          return 0;
        }
        break;
      case 2:
        if (iVar6 < 7) {
          stbi__fill_bits(a);
        }
        iVar6 = a->num_bits;
        uVar9 = a->code_buffer;
        a->code_buffer = uVar9 >> 5;
        a->num_bits = iVar6 + -5;
        if (iVar6 < 10) {
          stbi__fill_bits(a);
        }
        iVar6 = a->num_bits;
        uVar13 = a->code_buffer;
        a->code_buffer = uVar13 >> 5;
        a->num_bits = iVar6 + -5;
        if (iVar6 < 9) {
          stbi__fill_bits(a);
        }
        uVar9 = uVar9 & 0x1f;
        iVar6 = uVar9 + 0x101;
        iVar16 = (uVar13 & 0x1f) + 1;
        uVar13 = a->code_buffer;
        a->code_buffer = uVar13 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08[0] = 0;
        local_a08[1] = 0;
        local_a08[2] = 0;
        local_a08[3] = 0;
        local_a08[4] = 0;
        local_a08[5] = 0;
        local_a08[6] = 0;
        local_a08[7] = 0;
        local_a08[8] = 0;
        local_a08[9] = 0;
        local_a08[10] = 0;
        local_a08[0xb] = 0;
        local_a08[0xc] = 0;
        local_a08[0xd] = 0;
        local_a08[0xe] = 0;
        local_a08[0xf] = 0;
        local_a08[0x10] = 0;
        local_a08[0x11] = 0;
        local_a08[0x12] = 0;
        lVar20 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar17 = a->code_buffer;
          a->code_buffer = uVar17 >> 3;
          a->num_bits = a->num_bits + -3;
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar20]] =
               (byte)uVar17 & 7;
          lVar20 = lVar20 + 1;
        } while ((ulong)(uVar13 & 0xf) + 4 != lVar20);
        iVar5 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar5 == 0) {
          return 0;
        }
        uVar13 = iVar16 + iVar6;
        uVar17 = 0;
        while ((int)uVar17 < (int)uVar13) {
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar19 = a->code_buffer;
          uVar8 = local_814.fast[uVar19 & 0x1ff];
          if (uVar8 == 0) {
            uVar8 = (ushort)uVar19 << 8 | (ushort)uVar19 >> 8;
            uVar10 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
            uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
            uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
            lVar20 = 0;
            do {
              lVar11 = lVar20;
              lVar20 = lVar11 + 1;
            } while (local_814.maxcode[lVar11 + 10] <= (int)uVar10);
            uVar18 = 0xffffffff;
            if (lVar20 != 7) {
              lVar15 = (ulong)local_814.firstsymbol[lVar11 + 10] +
                       ((ulong)(uVar10 >> (7U - (char)lVar20 & 0x1f)) -
                       (ulong)local_814.firstcode[lVar11 + 10]);
              if ((ulong)*(byte *)((long)&local_814 + lVar15 + 0x484) - 9 != lVar20)
              goto LAB_001122c9;
              a->code_buffer = uVar19 >> ((char)lVar11 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar20) + -9;
              uVar18 = (uint)*(ushort *)((long)&local_814 + lVar15 * 2 + 0x5a4);
            }
          }
          else {
            a->code_buffer = uVar19 >> ((byte)(uVar8 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar8 >> 9);
            uVar18 = uVar8 & 0x1ff;
          }
          if (uVar18 < 0x13) {
            if ((int)uVar18 < 0x10) {
              lVar20 = (long)(int)uVar17;
              uVar17 = uVar17 + 1;
              abStack_9e9[lVar20 + 1] = (char)uVar18;
            }
            else {
              iVar5 = a->num_bits;
              if (uVar18 == 0x11) {
                if (iVar5 < 3) {
                  stbi__fill_bits(a);
                }
                uVar19 = a->code_buffer;
                a->code_buffer = uVar19 >> 3;
                a->num_bits = a->num_bits + -3;
                sVar21 = (ulong)(uVar19 & 7) + 3;
                memset(abStack_9e9 + (long)(int)uVar17 + 1,0,sVar21);
                uVar17 = uVar17 + (int)sVar21;
              }
              else {
                if (uVar18 == 0x10) {
                  if (iVar5 < 2) {
                    stbi__fill_bits(a);
                  }
                  uVar19 = a->code_buffer;
                  a->code_buffer = uVar19 >> 2;
                  a->num_bits = a->num_bits + -2;
                  sVar21 = (ulong)(uVar19 & 3) + 3;
                  uVar19 = (uint)abStack_9e9[(int)uVar17];
                }
                else {
                  if (iVar5 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar19 = a->code_buffer;
                  a->code_buffer = uVar19 >> 7;
                  a->num_bits = a->num_bits + -7;
                  sVar21 = (ulong)(uVar19 & 0x7f) + 0xb;
                  uVar19 = 0;
                }
                memset(abStack_9e9 + (long)(int)uVar17 + 1,uVar19,sVar21);
                uVar17 = uVar17 + (int)sVar21;
              }
            }
          }
          else {
            stbi__g_failure_reason = "bad codelengths";
          }
          if (0x12 < uVar18) {
            return 0;
          }
        }
        if (uVar17 != uVar13) {
          stbi__g_failure_reason = "bad codelengths";
          return 0;
        }
        iVar6 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar6);
        if (iVar6 == 0) {
          return 0;
        }
        iVar6 = stbi__zbuild_huffman(&a->z_distance,asStack_8e7 + uVar9,iVar16);
        if (iVar6 == 0) goto LAB_0011229b;
        break;
      case 3:
        goto switchD_001119b3_caseD_3;
      }
      zout = a->zout;
      do {
        if (a->num_bits < 0x10) {
          stbi__fill_bits(a);
        }
        uVar9 = a->code_buffer;
        uVar8 = (a->z_length).fast[uVar9 & 0x1ff];
        if (uVar8 == 0) {
          uVar8 = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
          uVar17 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
          uVar17 = (uVar17 >> 2 & 0x3333) + (uVar17 & 0x3333) * 4;
          uVar17 = (uVar17 >> 1 & 0x5555) + (uVar17 & 0x5555) * 2;
          lVar20 = 0;
          do {
            lVar11 = lVar20;
            lVar20 = lVar11 + 1;
          } while ((a->z_length).maxcode[lVar11 + 10] <= (int)uVar17);
          uVar19 = 0xffffffff;
          if (lVar20 != 7) {
            lVar15 = (ulong)(a->z_length).firstsymbol[lVar11 + 10] +
                     ((ulong)(uVar17 >> (7U - (char)lVar20 & 0x1f)) -
                     (ulong)(a->z_length).firstcode[lVar11 + 10]);
            if ((ulong)*(byte *)((long)a + lVar15 + 0x4b8) - 9 != lVar20) {
LAB_001122c9:
              __assert_fail("z->size[b] == s",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/stb_image.h"
                            ,0xe22,
                            "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
            }
            a->code_buffer = uVar9 >> ((char)lVar11 + 10U & 0x1f);
            a->num_bits = (a->num_bits - (int)lVar20) + -9;
            uVar19 = (uint)*(ushort *)((long)a + lVar15 * 2 + 0x5d8);
          }
        }
        else {
          a->code_buffer = uVar9 >> ((byte)(uVar8 >> 9) & 0x1f);
          a->num_bits = a->num_bits - (uint)(uVar8 >> 9);
          uVar19 = uVar8 & 0x1ff;
        }
        if ((int)uVar19 < 0x100) {
          if ((int)uVar19 < 0) {
LAB_00112111:
            stbi__g_failure_reason = "bad huffman code";
LAB_0011211f:
            bVar3 = false;
            uVar13 = 0;
          }
          else {
            if (a->zout_end <= zout) {
              iVar6 = stbi__zexpand(a,zout,1);
              if (iVar6 == 0) goto LAB_0011211f;
              zout = a->zout;
            }
            *zout = (char)uVar19;
            zout = zout + 1;
            bVar3 = true;
          }
        }
        else if (uVar19 == 0x100) {
          a->zout = zout;
          uVar13 = 1;
          bVar3 = false;
        }
        else {
          uVar7 = (ulong)(uVar19 - 0x101);
          uVar9 = stbi__zlength_base[uVar7];
          if (0xffffffffffffffeb < uVar7 - 0x1c) {
            iVar6 = stbi__zlength_extra[uVar7];
            if (a->num_bits < iVar6) {
              stbi__fill_bits(a);
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> ((byte)iVar6 & 0x1f);
            a->num_bits = a->num_bits - iVar6;
            uVar9 = uVar9 + (~(-1 << ((byte)iVar6 & 0x1f)) & uVar17);
          }
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar17 = a->code_buffer;
          uVar8 = (a->z_distance).fast[uVar17 & 0x1ff];
          if (uVar8 == 0) {
            uVar8 = (ushort)uVar17 << 8 | (ushort)uVar17 >> 8;
            uVar19 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
            uVar19 = (uVar19 >> 2 & 0x3333) + (uVar19 & 0x3333) * 4;
            uVar19 = (uVar19 >> 1 & 0x5555) + (uVar19 & 0x5555) * 2;
            lVar20 = 0;
            do {
              lVar11 = lVar20;
              lVar20 = lVar11 + 1;
            } while ((a->z_distance).maxcode[lVar11 + 10] <= (int)uVar19);
            uVar10 = 0xffffffff;
            if (lVar20 != 7) {
              lVar15 = (ulong)(a->z_distance).firstsymbol[lVar11 + 10] +
                       ((ulong)(uVar19 >> (7U - (char)lVar20 & 0x1f)) -
                       (ulong)(a->z_distance).firstcode[lVar11 + 10]);
              if ((ulong)*(byte *)((long)a + lVar15 + 0xc9c) - 9 != lVar20) goto LAB_001122c9;
              a->code_buffer = uVar17 >> ((char)lVar11 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar20) + -9;
              uVar10 = (uint)*(ushort *)((long)a + lVar15 * 2 + 0xdbc);
            }
          }
          else {
            a->code_buffer = uVar17 >> ((byte)(uVar8 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar8 >> 9);
            uVar10 = uVar8 & 0x1ff;
          }
          if ((int)uVar10 < 0) goto LAB_00112111;
          uVar7 = (ulong)uVar10;
          iVar6 = stbi__zdist_base[uVar7];
          if (0xffffffffffffffe5 < uVar7 - 0x1e) {
            iVar16 = stbi__zdist_extra[uVar7];
            if (a->num_bits < iVar16) {
              stbi__fill_bits(a);
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> ((byte)iVar16 & 0x1f);
            a->num_bits = a->num_bits - iVar16;
            iVar6 = iVar6 + (~(-1 << ((byte)iVar16 & 0x1f)) & uVar17);
          }
          if ((long)zout - (long)a->zout_start < (long)iVar6) {
            stbi__g_failure_reason = "bad dist";
LAB_00112104:
            bVar3 = false;
            uVar13 = 0;
          }
          else {
            if (a->zout_end < zout + (int)uVar9) {
              iVar16 = stbi__zexpand(a,zout,uVar9);
              if (iVar16 == 0) goto LAB_00112104;
              zout = a->zout;
            }
            lVar20 = -(long)iVar6;
            bVar3 = true;
            if (iVar6 == 1) {
              if (uVar9 != 0) {
                memset(zout,(uint)(byte)zout[lVar20],(ulong)uVar9);
                zout = zout + (ulong)(uVar9 - 1) + 1;
              }
            }
            else {
              for (; uVar9 != 0; uVar9 = uVar9 - 1) {
                *zout = zout[lVar20];
                zout = zout + 1;
              }
            }
          }
        }
      } while (bVar3);
      if (uVar13 == 0) {
        return 0;
      }
LAB_0011225e:
    } while ((uVar4 & 1) == 0);
    local_a30 = 1;
  }
  else {
    pbVar1 = a->zbuffer;
    uVar9 = 0;
    uVar4 = 0;
    if (pbVar1 < a->zbuffer_end) {
      a->zbuffer = pbVar1 + 1;
      uVar4 = (uint)*pbVar1;
    }
    pbVar1 = a->zbuffer;
    if (pbVar1 < a->zbuffer_end) {
      a->zbuffer = pbVar1 + 1;
      uVar9 = (uint)*pbVar1;
    }
    if ((uVar4 << 8 | uVar9) * -0x42108421 < 0x8421085) {
      if ((uVar9 & 0x20) == 0) {
        if ((uVar4 & 0xf) == 8) goto LAB_00111932;
        stbi__g_failure_reason = "bad compression";
      }
      else {
        stbi__g_failure_reason = "no preset dict";
      }
    }
    else {
      stbi__g_failure_reason = "bad zlib header";
    }
LAB_0011229b:
    local_a30 = 0;
  }
switchD_001119b3_caseD_3:
  return local_a30;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}